

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::encryption_handler::encrypt(encryption_handler *this,char *__block,int __edflag)

{
  undefined8 uVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  *this_00;
  undefined1 *__s;
  ulong uVar5;
  ulong uVar6;
  ulong in_RCX;
  long lVar7;
  undefined4 in_register_00000014;
  undefined1 *puVar8;
  ulong uVar9;
  undefined1 *puVar10;
  int iVar11;
  iterator __position;
  undefined4 uVar12;
  uint uVar13;
  uint uVar14;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  _List_node_base *local_60;
  _List_node_base *local_58;
  undefined4 local_50;
  encryption_handler *local_48;
  _List_node_base *local_40;
  list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  *local_38;
  
  puVar8 = (undefined1 *)CONCAT44(in_register_00000014,__edflag);
  puVar10 = auStack_68;
  __position._M_node = *(_List_node_base **)__block;
  uVar14 = *(uint *)&__position._M_node[2]._M_next;
  local_48 = this;
  local_38 = (list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
              *)__block;
  if (uVar14 == 0x7fffffff) {
    uVar14 = 0x7fffffff;
    uVar6 = in_RCX;
    __s = puVar8;
  }
  else {
    if ((long)in_RCX < 0x101) {
      if ((long)in_RCX < 1) {
        __s = (undefined1 *)0x0;
        puVar10 = auStack_68;
      }
      else {
        __s = auStack_68 + in_RCX * -0x10;
        *(undefined8 *)(auStack_68 + in_RCX * -0x10 + -8) = 0x3a0717;
        memset(__s,0,in_RCX * 0x10);
        puVar10 = __s;
      }
    }
    else {
      uStack_70 = 0x3a06df;
      local_40 = __position._M_node;
      __s = (undefined1 *)operator_new__(-(ulong)(in_RCX >> 0x3c != 0) | in_RCX << 4);
      uStack_70 = 0x3a06ef;
      memset(__s,0,in_RCX << 4);
      puVar10 = auStack_68;
      __position._M_node = local_40;
    }
    if ((int)uVar14 < 1) {
      uVar6 = 0;
    }
    else {
      uVar9 = 0;
      if (0 < (long)in_RCX) {
        uVar9 = in_RCX;
      }
      lVar7 = 8;
      uVar5 = 0;
      uVar13 = uVar14;
      do {
        uVar6 = uVar9;
        uVar14 = uVar13;
        if (uVar9 == uVar5) break;
        uVar6 = uVar5 + 1;
        uVar1 = *(undefined8 *)(puVar8 + lVar7);
        iVar11 = (int)uVar1;
        if ((int)uVar13 < iVar11) {
          *(undefined8 *)(__s + lVar7 + -8) = *(undefined8 *)(puVar8 + lVar7 + -8);
          *(ulong *)(__s + lVar7) = (ulong)uVar13;
          uVar14 = 0;
          break;
        }
        *(undefined8 *)(__s + lVar7 + -8) = *(undefined8 *)(puVar8 + lVar7 + -8);
        *(undefined8 *)(__s + lVar7) = uVar1;
        lVar7 = lVar7 + 0x10;
        uVar14 = uVar13 - iVar11;
        bVar4 = iVar11 <= (int)uVar13;
        uVar5 = uVar6;
        uVar13 = uVar14;
      } while (uVar14 != 0 && bVar4);
      uVar6 = uVar6 & 0xffffffff;
    }
    if (0x100 < (long)in_RCX) {
      if (__s == (undefined1 *)0x0) {
        __s = (undefined1 *)0x0;
      }
      else {
        *(undefined8 *)(puVar10 + -8) = 0x3a0793;
        operator_delete__(__s);
        __position._M_node =
             (local_38->
             super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
             )._M_impl._M_node.super__List_node_base._M_next;
      }
    }
  }
  if (uVar6 == 0) {
    local_60 = (_List_node_base *)0x0;
    local_58 = (_List_node_base *)0x0;
    local_50 = 0;
  }
  else {
    p_Var2 = __position._M_node[1]._M_next;
    p_Var3 = p_Var2->_M_next[2]._M_next;
    *(undefined8 *)(puVar10 + -8) = 0x3a07bb;
    (*(code *)p_Var3)(&local_60,p_Var2,__s,uVar6);
    __position._M_node =
         (local_38->
         super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
         )._M_impl._M_node.super__List_node_base._M_next;
  }
  this_00 = local_38;
  uVar12 = local_50;
  if (*(int *)&__position._M_node[2]._M_next != 0x7fffffff) {
    if (uVar14 == 0) {
      if ((local_38->
          super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
          )._M_impl._M_node._M_size == 1) {
        uVar12 = 0x7fffffff;
      }
      *(undefined8 *)(puVar10 + -8) = 0x3a0806;
      ::std::__cxx11::
      list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
      ::_M_erase(this_00,__position);
    }
    else {
      *(uint *)&__position._M_node[2]._M_next = uVar14;
    }
  }
  (local_48->m_send_barriers).
  super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  ._M_impl._M_node.super__List_node_base._M_next = local_60;
  (local_48->m_send_barriers).
  super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  ._M_impl._M_node.super__List_node_base._M_prev = local_58;
  *(undefined4 *)
   &(local_48->m_send_barriers).
    super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
    ._M_impl._M_node._M_size = uVar12;
  return;
}

Assistant:

std::tuple<int, span<span<char const>>>
	encryption_handler::encrypt(
		span<span<char>> iovec)
	{
		TORRENT_ASSERT(!m_send_barriers.empty());
		TORRENT_ASSERT(m_send_barriers.front().enc_handler);

		int to_process = m_send_barriers.front().next;

		span<span<char>> bufs;
		bool need_destruct = false;
		if (to_process != INT_MAX)
		{
			TORRENT_ALLOCA(abufs, span<char>, iovec.size());
			bufs = abufs;
			need_destruct = true;
			int num_bufs = 0;
			for (int i = 0; to_process > 0 && i < iovec.size(); ++i)
			{
				++num_bufs;
				int const size = int(iovec[i].size());
				if (to_process < size)
				{
					new (&bufs[i]) span<char>(
						iovec[i].data(), to_process);
					to_process = 0;
				}
				else
				{
					new (&bufs[i]) span<char>(iovec[i]);
					to_process -= size;
				}
			}
			bufs = bufs.first(num_bufs);
		}
		else
		{
			bufs = iovec;
		}

		int next_barrier = 0;
		span<span<char const>> out_iovec;
		if (!bufs.empty())
		{
			std::tie(next_barrier, out_iovec)
				= m_send_barriers.front().enc_handler->encrypt(bufs);
		}

		if (m_send_barriers.front().next != INT_MAX)
		{
			// to_process holds the difference between the size of the buffers
			// and the bytes left to the next barrier
			// if it's zero then pop the barrier
			// otherwise update the number of bytes remaining to the next barrier
			if (to_process == 0)
			{
				if (m_send_barriers.size() == 1)
				{
					// transitioning back to plaintext
					next_barrier = INT_MAX;
				}
				m_send_barriers.pop_front();
			}
			else
			{
				m_send_barriers.front().next = to_process;
			}
		}

#if TORRENT_USE_ASSERTS
		if (next_barrier != INT_MAX && next_barrier != 0)
		{
			int payload = 0;
			for (auto buf : bufs)
				payload += int(buf.size());

			int overhead = 0;
			for (auto buf : out_iovec)
				overhead += int(buf.size());
			TORRENT_ASSERT(overhead + payload == next_barrier);
		}
#endif
		if (need_destruct)
		{
			for (auto buf : bufs)
				buf.~span<char>();
		}
		return std::make_tuple(next_barrier, out_iovec);
	}